

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O1

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::ModuleLoader::Impl::readEmbedFromSearchPath
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,Impl *this,PathPtr path)

{
  ReadableDirectory **ppRVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 unaff_R12;
  ReadableDirectory **ppRVar4;
  ArrayDisposer *local_60;
  size_t local_58;
  Maybe<kj::Array<const_unsigned_char>_> local_50;
  
  ppRVar4 = (this->searchPath).builder.ptr;
  ppRVar1 = (this->searchPath).builder.pos;
  do {
    bVar2 = ppRVar4 != ppRVar1;
    if (!bVar2) {
LAB_0011432a:
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    readEmbed(&local_50,this,*ppRVar4,path);
    uVar3 = local_50.ptr.field_1.value.ptr;
    if (local_50.ptr.isSet == true) {
      local_58 = local_50.ptr.field_1.value.size_;
      local_60 = local_50.ptr.field_1.value.disposer;
      local_50.ptr.field_1.value.ptr = (uchar *)0x0;
      local_50.ptr.field_1.value.size_ = 0;
      unaff_R12 = uVar3;
    }
    if (local_50.ptr.isSet != false) {
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.ptr = (uchar *)unaff_R12;
      (__return_storage_ptr__->ptr).field_1.value.size_ = local_58;
      (__return_storage_ptr__->ptr).field_1.value.disposer = local_60;
      if (bVar2) {
        return __return_storage_ptr__;
      }
      goto LAB_0011432a;
    }
    ppRVar4 = ppRVar4 + 1;
    local_50.ptr.isSet = false;
  } while( true );
}

Assistant:

kj::Maybe<kj::Array<const byte>> ModuleLoader::Impl::readEmbedFromSearchPath(kj::PathPtr path) {
  for (auto candidate: searchPath) {
    KJ_IF_SOME(module, readEmbed(*candidate, path)) {
      return kj::mv(module);
    }
  }
  return kj::none;
}